

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chromosome.cpp
# Opt level: O0

void __thiscall Chromosome::printInfo(Chromosome *this)

{
  ostream *poVar1;
  size_type sVar2;
  void *pvVar3;
  undefined1 local_20 [8];
  json j_vec;
  Chromosome *this_local;
  
  j_vec.m_value = (json_value)this;
  poVar1 = std::operator<<((ostream *)&std::cout,"### Bester Kandidat ###");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Pairs: ");
  sVar2 = std::
          vector<std::pair<Coordinate,_Coordinate>,_std::allocator<std::pair<Coordinate,_Coordinate>_>_>
          ::size(&this->pairs);
  pvVar3 = (void *)std::ostream::operator<<(poVar1,sVar2);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Collisions: ");
  pvVar3 = (void *)std::ostream::operator<<(poVar1,this->collisions);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Fitness: ");
  pvVar3 = (void *)std::ostream::operator<<(poVar1,this->fitness);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"ID: ");
  pvVar3 = (void *)std::ostream::operator<<(poVar1,this->id);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"#######################");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
  ::basic_json<std::vector<TURNCODE,_std::allocator<TURNCODE>_>,_0>
            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
              *)local_20,&this->turnList);
  poVar1 = nlohmann::operator<<
                     ((ostream *)&std::cout,
                      (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
                       *)local_20);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  printCoordinates(this);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
                 *)local_20);
  return;
}

Assistant:

void Chromosome::printInfo() {
    std::cout << "### Bester Kandidat ###" << std::endl;
    std::cout << "Pairs: " << pairs.size() << std::endl;
    std::cout << "Collisions: " << collisions << std::endl;
    std::cout << "Fitness: " << fitness << std::endl;
    std::cout << "ID: " << id << std::endl;
    std::cout << "#######################" << std::endl;

    json j_vec(turnList);
    std::cout << j_vec << std::endl;
    printCoordinates();

}